

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsValue.c
# Opt level: O0

void JsToBoolean(JsValue *val,JsValue *res)

{
  undefined4 uVar1;
  size_t sVar2;
  JsValue *res_local;
  JsValue *val_local;
  
  res->type = JS_BOOLEAN;
  switch(val->type) {
  case JS_UNDEFINED:
  case JS_NULL:
    (res->u).boolean = 0;
    break;
  case JS_BOOLEAN:
    uVar1 = *(undefined4 *)&val->field_0x4;
    res->type = val->type;
    *(undefined4 *)&res->field_0x4 = uVar1;
    (res->u).number = (val->u).number;
    (res->u).reference.name = (val->u).reference.name;
    break;
  case JS_NUMBER:
    if ((((val->u).number == 0.0) && (!NAN((val->u).number))) || (NAN((val->u).number))) {
      (res->u).boolean = 0;
    }
    else {
      (res->u).boolean = 1;
    }
    break;
  case JS_STRING:
    if (((val->u).object == (JsObject *)0x0) || (sVar2 = strlen((val->u).string), sVar2 == 0)) {
      (res->u).boolean = 0;
    }
    else {
      (res->u).boolean = 1;
    }
    break;
  case JS_OBJECT:
    (res->u).boolean = 1;
    break;
  default:
    JsThrowString("JsToBooleanError");
  }
  return;
}

Assistant:

void JsToBoolean(struct JsValue *val, struct JsValue *res){
	
	res->type  = JS_BOOLEAN;
	switch (val->type) {
	case JS_UNDEFINED:
	case JS_NULL:
		res->u.boolean = FALSE;
		break;
	case JS_BOOLEAN:
		*res  = * val;
		break;
	case JS_NUMBER:
		if (val->u.number == 0 || isnan(val->u.number))
			res->u.boolean = FALSE;
		else
			res->u.boolean = TRUE;
		break;
	case JS_STRING:
		if (val->u.string == NULL || strlen(val->u.string) == 0)
			res->u.boolean = FALSE;
		else
			res->u.boolean = TRUE;
		break;
	case JS_OBJECT:
		res->u.boolean = TRUE;
		break;
	default:
		JsThrowString("JsToBooleanError");
	}
}